

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Set(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t pos,bool val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  byte bVar3;
  undefined3 in_register_00000011;
  iterator __ret;
  _List_node_base *p_Var4;
  
  p_Var4 = (this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (CONCAT31(in_register_00000011,val) != 0) {
    if (p_Var4 != (_List_node_base *)this) {
      bVar3 = (byte)pos & 0x3f;
      do {
        psVar1 = (size_t *)((long)(p_Var4 + 1) + (pos >> 6) * 8);
        *psVar1 = *psVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        p_Var4 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var4->_M_next)->
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
      } while (p_Var4 != (_List_node_base *)this);
    }
    Normalize(this);
    return;
  }
  if (p_Var4 != (_List_node_base *)this) {
    do {
      p_Var2 = p_Var4->_M_next;
      if ((*(ulong *)((long)(p_Var4 + 1) + (pos >> 6) * 8) & 1L << ((byte)pos & 0x3f)) != 0) {
        psVar1 = &(this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x18);
      }
      p_Var4 = p_Var2;
    } while (p_Var2 != (_List_node_base *)this);
  }
  return;
}

Assistant:

void Set(size_t pos, bool val)
	{	
		if (val == 0)
		{
			for (iterator iter = begin(); iter != end();)
				if (iter->Test(pos))
					iter = erase(iter);
				else
					++iter;
		}
		else
		{
			for (iterator iter = begin(); iter != end(); ++iter)
				iter->Set(pos, 0);
			Normalize();
		}
	}